

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O1

int add_not_list_to_class
              (uint8_t *classbits,PCRE2_UCHAR8 **uchardptr,uint32_t options,compile_block_8 *cb,
              uint32_t *p)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int in_EAX;
  uint32_t *puVar3;
  uint32_t end;
  
  if (*p != 0) {
    in_EAX = add_to_class(classbits,uchardptr,options,cb,0,*p - 1);
  }
  if (*p != 0xffffffff) {
    do {
      do {
        puVar3 = p + 1;
        uVar1 = *p;
        uVar2 = *puVar3;
        p = puVar3;
      } while (uVar2 == uVar1 + 1);
      end = uVar2 - 1;
      if (uVar2 == 0xffffffff) {
        end = ((options >> 0x13 & 1) != 0) - 1 | 0x10ffff;
      }
      in_EAX = add_to_class(classbits,uchardptr,options,cb,uVar1 + 1,end);
    } while (*puVar3 != 0xffffffff);
  }
  return in_EAX;
}

Assistant:

static int
add_not_list_to_class(uint8_t *classbits, PCRE2_UCHAR **uchardptr,
  uint32_t options, compile_block *cb, const uint32_t *p)
{
BOOL utf = (options & PCRE2_UTF) != 0;
int n8 = 0;
if (p[0] > 0)
  n8 += add_to_class(classbits, uchardptr, options, cb, 0, p[0] - 1);
while (p[0] < NOTACHAR)
  {
  while (p[1] == p[0] + 1) p++;
  n8 += add_to_class(classbits, uchardptr, options, cb, p[0] + 1,
    (p[1] == NOTACHAR) ? (utf ? 0x10ffffu : 0xffffffffu) : p[1] - 1);
  p++;
  }
return n8;
}